

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  uint *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  pointer pnVar4;
  DataKey *pDVar5;
  int *piVar6;
  Real RVar7;
  type_conflict5 tVar8;
  bool bVar9;
  bool bVar10;
  Result RVar11;
  uint uVar12;
  shared_ptr<soplex::Tolerances> *psVar13;
  ulong uVar14;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  DuplicateColsPS *pDVar15;
  undefined8 extraout_RAX;
  double *pdVar16;
  FixBoundsPS *pFVar17;
  pointer pDVar18;
  SPxOut *pSVar19;
  long lVar20;
  long lVar21;
  int j;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  Item *pIVar26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar27;
  long lVar28;
  ulong uVar29;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int remCols;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int *idxMem;
  undefined4 local_8d4;
  long local_8d0;
  IdxSet idxSet;
  ElementCompare compare;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  DataArray<int> da_perm;
  int *perm;
  uint auStack_790 [5];
  undefined3 uStack_77b;
  uint local_778;
  undefined3 uStack_773;
  int local_770;
  bool local_76c;
  undefined8 local_768;
  DuplicateColsPS *local_758;
  DataArray<bool> remCol;
  DataArray<int> classSize;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_710;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_700;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_6f0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_6e0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_6d0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_6c0;
  DataArray<bool> fixAndRemCol;
  cpp_dec_float<50U,_int,_void> local_698;
  DataArray<int> m_perm_empty;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_640;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_630;
  DataArray<int> local_620;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  int *local_348;
  uint auStack_340 [2];
  uint local_338 [2];
  uint auStack_330 [2];
  uint local_328 [2];
  int local_320;
  bool local_31c;
  fpclass_type local_318;
  int32_t iStack_314;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  DataArray<int> local_290;
  DataArray<int> local_278;
  cpp_dec_float<50U,_int,_void> local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  cpp_dec_float<50U,_int,_void> local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  remCols = 0;
  RVar11 = removeEmpty(this,lp);
  if (RVar11 == OKAY) {
    iVar24 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    RVar11 = OKAY;
    if (1 < iVar24) {
      DataArray<int>::DataArray(&pClass,iVar24,0,1.2);
      DataArray<int>::DataArray
                (&classSize,
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      idxSet.len = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_00331888;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar24 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *classSize.data = iVar24;
      lVar28 = 0x38;
      for (lVar22 = 1; lVar22 < iVar24; lVar22 = lVar22 + 1) {
        pClass.data[lVar22] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)((scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar28),0.0);
        classSize.data[lVar22] = 0;
        lVar20 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxSet.idx[lVar20] = (int)lVar22;
        iVar24 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        lVar28 = lVar28 + 0x38;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_698,0.0,(type *)0x0);
      psVar13 = &(this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances;
      lVar22 = 0;
      while (lVar22 < (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum) {
        pIVar26 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar22].idx;
        lVar20 = 0;
        lVar28 = 0;
        local_8d0 = lVar22;
        while( true ) {
          uVar14 = (ulong)(pIVar26->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
          if ((long)uVar14 <= lVar28) break;
          pNVar2 = (pIVar26->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          uVar3 = *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x20);
          compare.epsiloncompare.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
          compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ =
               (undefined3)((ulong)uVar3 >> 0x28);
          puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20);
          compare.epsiloncompare.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          compare.epsiloncompare.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x10);
          compare.epsiloncompare.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar3 = *(undefined8 *)(puVar1 + 2);
          compare.epsiloncompare.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
          compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ =
               (undefined3)((ulong)uVar3 >> 0x28);
          compare.epsiloncompare.m_backend.exp =
               *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20);
          compare.epsiloncompare.m_backend.neg =
               *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 4);
          compare.epsiloncompare.m_backend._48_8_ =
               *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 8);
          iVar24 = *(int *)((long)(&((pIVar26->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar20);
          da_perm.thesize = 0;
          da_perm.themax = 0;
          tVar8 = boost::multiprecision::operator==
                            (scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar24,(double *)&da_perm);
          if (tVar8) {
            *(ulong *)(scale.data.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.data._M_elems + 8
                      ) = CONCAT35(compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_,
                                   compare.epsiloncompare.m_backend.data._M_elems._32_5_);
            puVar1 = scale.data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = compare.epsiloncompare.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_,
                          compare.epsiloncompare.m_backend.data._M_elems._24_5_);
            *(undefined8 *)
             scale.data.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.data._M_elems =
                 compare.epsiloncompare.m_backend.data._M_elems._0_8_;
            *(undefined8 *)
             (scale.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.data._M_elems + 2) =
                 compare.epsiloncompare.m_backend.data._M_elems._8_8_;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.exp =
                 compare.epsiloncompare.m_backend.exp;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.neg =
                 compare.epsiloncompare.m_backend.neg;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.fpclass =
                 compare.epsiloncompare.m_backend.fpclass;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend.prec_elem =
                 compare.epsiloncompare.m_backend.prec_elem;
          }
          iVar27 = pClass.data[iVar24];
          pDVar18 = (this->m_classSetCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          da_perm.thesize = 0;
          da_perm.themax = 0;
          da_perm.data = (int *)0x0;
          da_perm.memFactor = 0.0;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)&da_perm,
                     (cpp_dec_float<50U,_int,_void> *)&compare,
                     &scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar24].m_backend);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar18 + iVar27,iVar24,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&da_perm);
          piVar6 = classSize.data + pClass.data[iVar24];
          *piVar6 = *piVar6 + -1;
          if (*piVar6 == 0) {
            lVar22 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar22] = pClass.data[iVar24];
          }
          lVar28 = lVar28 + 1;
          lVar20 = lVar20 + 0x3c;
        }
        for (lVar22 = 0; lVar22 < (int)uVar14; lVar22 = lVar22 + 1) {
          iVar24 = pClass.data
                   [(pIVar26->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem[lVar22].idx];
          if (0 < (this->m_classSetCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&da_perm,
                       &psVar13->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
            ;
            RVar7 = Tolerances::epsilon((Tolerances *)da_perm._0_8_);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_68,RVar7,(type *)0x0);
            ElementCompare::ElementCompare
                      (&compare,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_68);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
            pDVar18 = (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar27 = pDVar18[iVar24].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            if (1 < iVar27) {
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (pDVar18[iVar24].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem,iVar27,&compare,0,true);
              pDVar18 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar27 = *idxSet.idx;
            lVar28 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar28 + -1];
            lVar20 = 0;
            lVar28 = 0;
            while( true ) {
              if (pDVar18[iVar24].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused <= lVar28) break;
              if (lVar20 != 0) {
                pNVar2 = pDVar18[iVar24].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                local_2c8.m_backend.data._M_elems._32_8_ =
                     *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x20);
                puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20);
                local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_2c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x10);
                local_2c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                local_2c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                local_2c8.m_backend.exp =
                     *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20);
                local_2c8.m_backend.neg =
                     *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 4U);
                local_2c8.m_backend._48_8_ =
                     *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 8U);
                local_308.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
                local_308.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
                local_308.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
                local_308.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
                local_308.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
                local_308.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
                local_308.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
                local_308.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
                local_308.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
                local_308.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
                local_308.m_backend.exp = local_698.exp;
                local_308.m_backend.neg = local_698.neg;
                local_308.m_backend.fpclass = local_698.fpclass;
                local_308.m_backend.prec_elem = local_698.prec_elem;
                epsZero(&local_a0,this);
                bVar9 = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_2c8,&local_308,&local_a0);
                if (bVar9) {
                  iVar27 = *idxSet.idx;
                  lVar21 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar21 + -1];
                }
              }
              pDVar18 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar2 = pDVar18[iVar24].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pClass.data[*(int *)((long)(&pNVar2->val + 1) + lVar20)] = iVar27;
              classSize.data[iVar27] = classSize.data[iVar27] + 1;
              local_698.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x20);
              puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20);
              local_698.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_698.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar20 + 0x10);
              local_698.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_698.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_698.exp = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20);
              local_698.neg = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 4U);
              local_698._48_8_ =
                   *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar20 + 8U);
              lVar28 = lVar28 + 1;
              lVar20 = lVar20 + 0x3c;
            }
            pDVar18[iVar24].
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused = 0;
            uVar14 = (ulong)(uint)(pIVar26->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused;
          }
        }
        lVar22 = local_8d0 + 1;
      }
      free(idxMem);
      idxMem = (int *)0x0;
      DataArray<bool>::DataArray
                (&remCol,(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum,0,1.2);
      lVar22 = 0;
      DataArray<bool>::DataArray
                (&fixAndRemCol,
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      uVar12 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      pDVar18 = (this->m_dupCols).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = 0;
      if (0 < (int)uVar12) {
        uVar14 = (ulong)uVar12;
      }
      for (; uVar14 * 0x20 != lVar22; lVar22 = lVar22 + 0x20) {
        *(undefined4 *)
         ((long)&(pDVar18->
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).memused + lVar22) = 0;
      }
      for (lVar22 = 0; lVar22 < (int)uVar12; lVar22 = lVar22 + 1) {
        remCol.data[lVar22] = false;
        fixAndRemCol.data[lVar22] = false;
        iVar24 = pClass.data[lVar22];
        pDVar18 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&compare,0.0,(type *)0x0);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(pDVar18 + iVar24,(int)lVar22,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&compare);
        uVar12 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
      }
      DataArray<int>::DataArray(&m_perm_empty,0,0,1.2);
      this_00 = &this->m_hist;
      bVar9 = false;
      for (lVar22 = 0;
          lVar28 = (long)(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum, lVar22 < lVar28; lVar22 = lVar22 + 1) {
        pDVar18 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((1 < pDVar18[lVar22].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused) &&
           ((lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem
            [(lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey
             [(pDVar18[lVar22].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem)->idx].idx].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused != 1)) {
          if (!bVar9) {
            pDVar15 = (DuplicateColsPS *)operator_new(0x168);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_d8,1.0,(type *)0x0);
            DataArray<int>::DataArray(&local_278,&m_perm_empty);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_630,
                       &psVar13->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
            ;
            DuplicateColsPS::DuplicateColsPS
                      (pDVar15,lp,0,0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d8,&local_278,(shared_ptr<soplex::Tolerances> *)&local_630,true,
                       false);
            std::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
            ::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                      ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        *)&compare,pDVar15);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_630._M_refcount)
            ;
            DataArray<int>::~DataArray(&local_278);
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&this_00->data,(value_type *)&compare);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       (compare.epsiloncompare.m_backend.data._M_elems + 2));
            pDVar18 = (this->m_dupCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar9 = true;
          }
          lVar21 = 0;
          lVar20 = 0;
          while (lVar20 < pDVar18[lVar22].
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused) {
            lVar25 = 0;
            local_8d0 = lVar20;
            for (lVar23 = 0;
                lVar23 < pDVar18[lVar22].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused; lVar23 = lVar23 + 1) {
              if (lVar21 != lVar25) {
                pNVar2 = pDVar18[lVar22].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                iVar24 = pNVar2[local_8d0].idx;
                lVar20 = (long)iVar24;
                if (remCol.data[lVar20] == false) {
                  uVar12 = *(uint *)((long)(&pNVar2->val + 1) + lVar25);
                  if (remCol.data[(int)uVar12] == false) {
                    pnVar4 = (lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).object.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar3 = *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                    compare.epsiloncompare.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
                    compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ =
                         (undefined3)((ulong)uVar3 >> 0x28);
                    compare.epsiloncompare.m_backend.data._M_elems._0_8_ =
                         *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                    compare.epsiloncompare.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                    puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                    compare.epsiloncompare.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                    uVar3 = *(undefined8 *)(puVar1 + 2);
                    compare.epsiloncompare.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
                    compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)uVar3 >> 0x28);
                    compare.epsiloncompare.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                    compare.epsiloncompare.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                    compare.epsiloncompare.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                    compare.epsiloncompare.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                    da_perm._0_8_ = *(undefined8 *)&pnVar4[(int)uVar12].m_backend.data;
                    da_perm.data = *(int **)(pnVar4[(int)uVar12].m_backend.data._M_elems + 2);
                    da_perm.memFactor = *(Real *)(pnVar4[(int)uVar12].m_backend.data._M_elems + 4);
                    factor.m_backend.fpclass = cpp_dec_float_finite;
                    factor.m_backend.prec_elem = 10;
                    factor.m_backend.data._M_elems[0] = 0;
                    factor.m_backend.data._M_elems[1] = 0;
                    factor.m_backend.data._M_elems[2] = 0;
                    factor.m_backend.data._M_elems[3] = 0;
                    factor.m_backend.data._M_elems[4] = 0;
                    factor.m_backend.data._M_elems[5] = 0;
                    factor.m_backend.data._M_elems._24_5_ = 0;
                    factor.m_backend.data._M_elems[7]._1_3_ = 0;
                    factor.m_backend.data._M_elems._32_5_ = 0;
                    factor.m_backend.data._M_elems[9]._1_3_ = 0;
                    factor.m_backend.exp = 0;
                    factor.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&factor.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar12].m_backend);
                    result_1.m_backend.fpclass = cpp_dec_float_finite;
                    result_1.m_backend.prec_elem = 10;
                    result_1.m_backend.data._M_elems[0] = 0;
                    result_1.m_backend.data._M_elems[1] = 0;
                    result_1.m_backend.data._M_elems[2] = 0;
                    result_1.m_backend.data._M_elems[3] = 0;
                    result_1.m_backend.data._M_elems[4] = 0;
                    result_1.m_backend.data._M_elems[5] = 0;
                    result_1.m_backend.data._M_elems._24_5_ = 0;
                    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                    result_1.m_backend.data._M_elems._32_5_ = 0;
                    result_1.m_backend._37_8_ = 0;
                    boost::multiprecision::default_ops::
                    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)&da_perm,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
                    result_2.m_backend.fpclass = cpp_dec_float_finite;
                    result_2.m_backend.prec_elem = 10;
                    result_2.m_backend.data._M_elems[0] = 0;
                    result_2.m_backend.data._M_elems[1] = 0;
                    result_2.m_backend.data._M_elems[2] = 0;
                    result_2.m_backend.data._M_elems[3] = 0;
                    result_2.m_backend.data._M_elems[4] = 0;
                    result_2.m_backend.data._M_elems[5] = 0;
                    result_2.m_backend.data._M_elems._24_5_ = 0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                    result_2.m_backend.data._M_elems._32_5_ = 0;
                    result_2.m_backend._37_8_ = 0;
                    boost::multiprecision::default_ops::
                    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&result_2.m_backend,&result_1.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar12].m_backend);
                    local_768._0_4_ = cpp_dec_float_finite;
                    local_768._4_4_ = 10;
                    perm = (int *)0x0;
                    auStack_790[0] = 0;
                    auStack_790[1] = 0;
                    auStack_790[2] = 0;
                    auStack_790[3] = 0;
                    stack0xfffffffffffff880 = 0;
                    uStack_77b = 0;
                    _local_778 = 0;
                    uStack_773 = 0;
                    local_770 = 0;
                    local_76c = false;
                    boost::multiprecision::default_ops::
                    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)&perm,
                               (cpp_dec_float<50U,_int,_void> *)&compare,&result_2.m_backend);
                    auStack_330[1]._1_3_ = uStack_77b;
                    auStack_330._0_5_ = stack0xfffffffffffff880;
                    local_348 = perm;
                    auStack_340[0] = auStack_790[0];
                    auStack_340[1] = auStack_790[1];
                    local_338[0] = auStack_790[2];
                    local_338[1] = auStack_790[3];
                    local_328[1]._1_3_ = uStack_773;
                    local_328._0_5_ = _local_778;
                    local_320 = local_770;
                    local_31c = local_76c;
                    local_318 = (fpclass_type)local_768;
                    iStack_314 = local_768._4_4_;
                    epsZero(&local_110,this);
                    bVar10 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_348,&local_110);
                    pnVar4 = (lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).low.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (bVar10) {
                      local_388.m_backend.data._M_elems._32_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                      local_388.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                      local_388.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                      puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                      local_388.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                      local_388.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                      local_388.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                      local_388.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                      local_388.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                      local_388.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>(&local_148,0.0,(type *)0x0);
                      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                                   &result_2,
                                   &psVar13->
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      RVar7 = Tolerances::epsilon((Tolerances *)
                                                  result_2.m_backend.data._M_elems._0_8_);
                      bVar10 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                         (&local_388,
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)&local_148,RVar7);
                      if (bVar10) {
                        pnVar4 = (lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).up.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        local_3c8.m_backend.data._M_elems._32_8_ =
                             *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                        local_3c8.m_backend.data._M_elems._0_8_ =
                             *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                        local_3c8.m_backend.data._M_elems._8_8_ =
                             *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                        puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                        local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                        local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                        local_3c8.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                        local_3c8.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                        local_3c8.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                        local_3c8.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>(&local_180,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *
                                     )&result_1,
                                     &psVar13->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar7 = Tolerances::epsilon((Tolerances *)
                                                    result_1.m_backend.data._M_elems._0_8_);
                        bVar10 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                           (&local_3c8,
                                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&local_180,RVar7);
                        if (!bVar10) {
LAB_0029ea01:
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     (result_1.m_backend.data._M_elems + 2));
                          goto LAB_0029ea0e;
                        }
                        pnVar4 = (lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).low.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        local_408.m_backend.data._M_elems._32_8_ =
                             *(undefined8 *)(pnVar4[(int)uVar12].m_backend.data._M_elems + 8);
                        local_408.m_backend.data._M_elems._0_8_ =
                             *(undefined8 *)&pnVar4[(int)uVar12].m_backend.data;
                        local_408.m_backend.data._M_elems._8_8_ =
                             *(undefined8 *)(pnVar4[(int)uVar12].m_backend.data._M_elems + 2);
                        puVar1 = pnVar4[(int)uVar12].m_backend.data._M_elems + 4;
                        local_408.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                        local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                        local_408.m_backend.exp = pnVar4[(int)uVar12].m_backend.exp;
                        local_408.m_backend.neg = pnVar4[(int)uVar12].m_backend.neg;
                        local_408.m_backend.fpclass = pnVar4[(int)uVar12].m_backend.fpclass;
                        local_408.m_backend.prec_elem = pnVar4[(int)uVar12].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>(&local_1b8,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *
                                     )&ptr_1,&psVar13->
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar7 = Tolerances::epsilon((Tolerances *)
                                                    ptr_1.
                                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                        bVar10 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                           (&local_408,
                                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&local_1b8,RVar7);
                        if (!bVar10) {
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&ptr_1.
                                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          goto LAB_0029ea01;
                        }
                        pnVar4 = (lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).up.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        local_448.m_backend.data._M_elems._32_8_ =
                             *(undefined8 *)(pnVar4[(int)uVar12].m_backend.data._M_elems + 8);
                        local_448.m_backend.data._M_elems._0_8_ =
                             *(undefined8 *)&pnVar4[(int)uVar12].m_backend.data;
                        local_448.m_backend.data._M_elems._8_8_ =
                             *(undefined8 *)(pnVar4[(int)uVar12].m_backend.data._M_elems + 2);
                        puVar1 = pnVar4[(int)uVar12].m_backend.data._M_elems + 4;
                        local_448.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                        local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                        local_448.m_backend.exp = pnVar4[(int)uVar12].m_backend.exp;
                        local_448.m_backend.neg = pnVar4[(int)uVar12].m_backend.neg;
                        local_448.m_backend.fpclass = pnVar4[(int)uVar12].m_backend.fpclass;
                        local_448.m_backend.prec_elem = pnVar4[(int)uVar12].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>(&local_1f0,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_6c0,
                                     &psVar13->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar7 = Tolerances::epsilon(local_6c0._M_ptr);
                        bVar10 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                           (&local_448,
                                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&local_1f0,RVar7);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_6c0._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&ptr_1.
                                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   (result_1.m_backend.data._M_elems + 2));
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   (result_2.m_backend.data._M_elems + 2));
                        if (!bVar10) goto LAB_0029ea18;
                        local_758 = (DuplicateColsPS *)operator_new(0x168);
                        local_488.m_backend.data._M_elems[9]._1_3_ =
                             factor.m_backend.data._M_elems[9]._1_3_;
                        local_488.m_backend.data._M_elems._32_5_ =
                             factor.m_backend.data._M_elems._32_5_;
                        local_488.m_backend.data._M_elems[7]._1_3_ =
                             factor.m_backend.data._M_elems[7]._1_3_;
                        local_488.m_backend.data._M_elems._24_5_ =
                             factor.m_backend.data._M_elems._24_5_;
                        local_488.m_backend.data._M_elems[4] = factor.m_backend.data._M_elems[4];
                        local_488.m_backend.data._M_elems[5] = factor.m_backend.data._M_elems[5];
                        local_488.m_backend.data._M_elems[0] = factor.m_backend.data._M_elems[0];
                        local_488.m_backend.data._M_elems[1] = factor.m_backend.data._M_elems[1];
                        local_488.m_backend.data._M_elems[2] = factor.m_backend.data._M_elems[2];
                        local_488.m_backend.data._M_elems[3] = factor.m_backend.data._M_elems[3];
                        local_488.m_backend.exp = factor.m_backend.exp;
                        local_488.m_backend.neg = factor.m_backend.neg;
                        local_488.m_backend.fpclass = factor.m_backend.fpclass;
                        local_488.m_backend.prec_elem = factor.m_backend.prec_elem;
                        DataArray<int>::DataArray(&local_290,&m_perm_empty);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_6d0,
                                     &psVar13->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        pDVar15 = local_758;
                        local_8d4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                        DuplicateColsPS::DuplicateColsPS
                                  (local_758,lp,iVar24,uVar12,&local_488,&local_290,
                                   (shared_ptr<soplex::Tolerances> *)&local_6d0,false,false);
                        local_8d4 = 0;
                        std::
                        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        ::
                        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                    *)&ptr_1,pDVar15);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_6d0._M_refcount);
                        DataArray<int>::~DataArray(&local_290);
                        std::
                        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                        ::push_back(&this_00->data,(value_type *)&ptr_1);
                        result_2.m_backend.data._M_elems._0_8_ =
                             result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                        tVar8 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                        if (tVar8) {
                          pnVar4 = (lp->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pdVar16 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                          tVar8 = boost::multiprecision::operator<=(pnVar4 + (int)uVar12,&result_2);
                          if (tVar8) {
LAB_0029e26d:
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2a])(lp,(ulong)uVar12,&result_2.m_backend,0);
                          }
                          else {
                            pnVar4 = (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_1.m_backend,-*pdVar16,(type *)0x0);
                            tVar8 = boost::multiprecision::operator<=
                                              (pnVar4 + lVar20,
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&result_1.m_backend);
                            if (tVar8) goto LAB_0029e26d;
                            pnVar4 = (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            result_1.m_backend.fpclass = cpp_dec_float_finite;
                            result_1.m_backend.prec_elem = 10;
                            result_1.m_backend.data._M_elems[0] = 0;
                            result_1.m_backend.data._M_elems[1] = 0;
                            result_1.m_backend.data._M_elems[2] = 0;
                            result_1.m_backend.data._M_elems[3] = 0;
                            result_1.m_backend.data._M_elems[4] = 0;
                            result_1.m_backend.data._M_elems[5] = 0;
                            result_1.m_backend.data._M_elems._24_5_ = 0;
                            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                            result_1.m_backend.data._M_elems._32_5_ = 0;
                            result_1.m_backend._37_8_ = 0;
                            boost::multiprecision::default_ops::
                            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (&result_1.m_backend,&factor.m_backend,
                                       &pnVar4[lVar20].m_backend);
                            result_2.m_backend.fpclass = cpp_dec_float_finite;
                            result_2.m_backend.prec_elem = 10;
                            result_2.m_backend.data._M_elems[0] = 0;
                            result_2.m_backend.data._M_elems[1] = 0;
                            result_2.m_backend.data._M_elems[2] = 0;
                            result_2.m_backend.data._M_elems[3] = 0;
                            result_2.m_backend.data._M_elems[4] = 0;
                            result_2.m_backend.data._M_elems[5] = 0;
                            result_2.m_backend.data._M_elems._24_5_ = 0;
                            result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                            result_2.m_backend.data._M_elems._32_5_ = 0;
                            result_2.m_backend._37_8_ = 0;
                            boost::multiprecision::default_ops::
                            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (&result_2.m_backend,&pnVar4[(int)uVar12].m_backend,
                                       &result_1.m_backend);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2a])(lp,(ulong)uVar12,&result_2,0);
                          }
                          pnVar4 = (lp->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pdVar16 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                          tVar8 = boost::multiprecision::operator>=
                                            (pnVar4 + (int)uVar12,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&result_2.m_backend);
                          if (!tVar8) {
                            pnVar4 = (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_1.m_backend,*pdVar16,(type *)0x0);
                            tVar8 = boost::multiprecision::operator>=(pnVar4 + lVar20,&result_1);
                            if (!tVar8) {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              result_1.m_backend.fpclass = cpp_dec_float_finite;
                              result_1.m_backend.prec_elem = 10;
                              result_1.m_backend.data._M_elems[0] = 0;
                              result_1.m_backend.data._M_elems[1] = 0;
                              result_1.m_backend.data._M_elems[2] = 0;
                              result_1.m_backend.data._M_elems[3] = 0;
                              result_1.m_backend.data._M_elems[4] = 0;
                              result_1.m_backend.data._M_elems[5] = 0;
                              result_1.m_backend.data._M_elems._24_5_ = 0;
                              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                              result_1.m_backend.data._M_elems._32_5_ = 0;
                              result_1.m_backend._37_8_ = 0;
                              boost::multiprecision::default_ops::
                              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (&result_1.m_backend,&factor.m_backend,
                                         &pnVar4[lVar20].m_backend);
                              result_2.m_backend.fpclass = cpp_dec_float_finite;
                              result_2.m_backend.prec_elem = 10;
                              result_2.m_backend.data._M_elems[0] = 0;
                              result_2.m_backend.data._M_elems[1] = 0;
                              result_2.m_backend.data._M_elems[2] = 0;
                              result_2.m_backend.data._M_elems[3] = 0;
                              result_2.m_backend.data._M_elems[4] = 0;
                              result_2.m_backend.data._M_elems[5] = 0;
                              result_2.m_backend.data._M_elems._24_5_ = 0;
                              result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                              result_2.m_backend.data._M_elems._32_5_ = 0;
                              result_2.m_backend._37_8_ = 0;
                              boost::multiprecision::default_ops::
                              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (&result_2.m_backend,&pnVar4[(int)uVar12].m_backend,
                                         &result_1.m_backend);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])(lp,(ulong)uVar12,&result_2,0);
                              goto LAB_0029ef0e;
                            }
                          }
                          pdVar16 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x2d])(lp,(ulong)uVar12,&result_2.m_backend,0);
                        }
                        else {
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar8 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar8) {
                            pnVar4 = (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                            tVar8 = boost::multiprecision::operator<=
                                              (pnVar4 + (int)uVar12,&result_2);
                            if (tVar8) {
LAB_0029eaca:
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])(lp,(ulong)uVar12,&result_2.m_backend,0);
                            }
                            else {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_1.m_backend,*pdVar16,(type *)0x0);
                              tVar8 = boost::multiprecision::operator>=(pnVar4 + lVar20,&result_1);
                              if (tVar8) goto LAB_0029eaca;
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              result_1.m_backend.fpclass = cpp_dec_float_finite;
                              result_1.m_backend.prec_elem = 10;
                              result_1.m_backend.data._M_elems[0] = 0;
                              result_1.m_backend.data._M_elems[1] = 0;
                              result_1.m_backend.data._M_elems[2] = 0;
                              result_1.m_backend.data._M_elems[3] = 0;
                              result_1.m_backend.data._M_elems[4] = 0;
                              result_1.m_backend.data._M_elems[5] = 0;
                              result_1.m_backend.data._M_elems._24_5_ = 0;
                              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                              result_1.m_backend.data._M_elems._32_5_ = 0;
                              result_1.m_backend._37_8_ = 0;
                              boost::multiprecision::default_ops::
                              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (&result_1.m_backend,&factor.m_backend,
                                         &(lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                          m_backend);
                              result_2.m_backend.fpclass = cpp_dec_float_finite;
                              result_2.m_backend.prec_elem = 10;
                              result_2.m_backend.data._M_elems[0] = 0;
                              result_2.m_backend.data._M_elems[1] = 0;
                              result_2.m_backend.data._M_elems[2] = 0;
                              result_2.m_backend.data._M_elems[3] = 0;
                              result_2.m_backend.data._M_elems[4] = 0;
                              result_2.m_backend.data._M_elems[5] = 0;
                              result_2.m_backend.data._M_elems._24_5_ = 0;
                              result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                              result_2.m_backend.data._M_elems._32_5_ = 0;
                              result_2.m_backend._37_8_ = 0;
                              boost::multiprecision::default_ops::
                              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (&result_2.m_backend,&pnVar4[(int)uVar12].m_backend,
                                         &result_1.m_backend);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])(lp,(ulong)uVar12,&result_2,0);
                            }
                            pnVar4 = (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                            tVar8 = boost::multiprecision::operator>=
                                              (pnVar4 + (int)uVar12,&result_2);
                            if (!tVar8) {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_1.m_backend,-*pdVar16,(type *)0x0);
                              tVar8 = boost::multiprecision::operator<=
                                                (pnVar4 + lVar20,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_1.m_backend);
                              if (!tVar8) {
                                pnVar4 = (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                result_1.m_backend.fpclass = cpp_dec_float_finite;
                                result_1.m_backend.prec_elem = 10;
                                result_1.m_backend.data._M_elems[0] = 0;
                                result_1.m_backend.data._M_elems[1] = 0;
                                result_1.m_backend.data._M_elems[2] = 0;
                                result_1.m_backend.data._M_elems[3] = 0;
                                result_1.m_backend.data._M_elems[4] = 0;
                                result_1.m_backend.data._M_elems[5] = 0;
                                result_1.m_backend.data._M_elems._24_5_ = 0;
                                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                                result_1.m_backend.data._M_elems._32_5_ = 0;
                                result_1.m_backend._37_8_ = 0;
                                boost::multiprecision::default_ops::
                                eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                          (&result_1.m_backend,&factor.m_backend,
                                           &(lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                            m_backend);
                                result_2.m_backend.fpclass = cpp_dec_float_finite;
                                result_2.m_backend.prec_elem = 10;
                                result_2.m_backend.data._M_elems[0] = 0;
                                result_2.m_backend.data._M_elems[1] = 0;
                                result_2.m_backend.data._M_elems[2] = 0;
                                result_2.m_backend.data._M_elems[3] = 0;
                                result_2.m_backend.data._M_elems[4] = 0;
                                result_2.m_backend.data._M_elems[5] = 0;
                                result_2.m_backend.data._M_elems._24_5_ = 0;
                                result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                result_2.m_backend.data._M_elems._32_5_ = 0;
                                result_2.m_backend._37_8_ = 0;
                                boost::multiprecision::default_ops::
                                eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                          (&result_2.m_backend,&pnVar4[(int)uVar12].m_backend,
                                           &result_1.m_backend);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2d])(lp,(ulong)uVar12,&result_2,0);
                                goto LAB_0029ef0e;
                              }
                            }
                            pdVar16 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2d])(lp,(ulong)uVar12,&result_2.m_backend,0);
                          }
                        }
LAB_0029ef0e:
                        remCol.data[lVar20] = true;
                        piVar6 = (this->m_stat).data + 0xe;
                        *piVar6 = *piVar6 + 1;
                        this_01 = &ptr_1.
                                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount;
                      }
                      else {
LAB_0029ea0e:
                        this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                  (result_2.m_backend.data._M_elems + 2);
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
                    }
                    else {
                      pdVar16 = (double *)infinity();
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                      tVar8 = boost::multiprecision::operator<=
                                        (pnVar4 + (int)uVar12,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&result_2.m_backend);
                      if (tVar8) {
                        result_2.m_backend.data._M_elems._0_8_ =
                             result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                        tVar8 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                        if (tVar8) {
                          result_1.m_backend.data._M_elems._0_8_ =
                               result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar8 = boost::multiprecision::operator>
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&perm,(int *)&result_1);
                          if (!tVar8) goto LAB_0029e5f7;
                          pnVar4 = (lp->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pdVar16 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                          tVar8 = boost::multiprecision::operator>=
                                            (pnVar4 + lVar20,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&result_2.m_backend);
                          if (tVar8) {
LAB_0029ef54:
                            if (lVar28 <= lVar22) goto LAB_0029ef73;
                            RVar11 = UNBOUNDED;
                            goto LAB_0029f2d2;
                          }
                          pnVar4 = (lp->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pFVar17 = (FixBoundsPS *)operator_new(0x30);
                          local_4c8.m_backend.data._M_elems._32_8_ =
                               *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                          local_4c8.m_backend.data._M_elems._0_8_ =
                               *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                          local_4c8.m_backend.data._M_elems._8_8_ =
                               *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                          puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                          local_4c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                          local_4c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                          local_4c8.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                          local_4c8.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                          local_4c8.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                          local_4c8.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_6e0,
                                       &psVar13->
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          FixBoundsPS::FixBoundsPS
                                    (pFVar17,lp,iVar24,&local_4c8,
                                     (shared_ptr<soplex::Tolerances> *)&local_6e0);
                          std::
                          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          ::
                          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                      *)&result_2,pFVar17);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_6e0._M_refcount);
                          std::
                          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                          ::push_back(&this_00->data,(value_type *)&result_2);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x2a])
                                    (lp,lVar20,
                                     (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
LAB_0029e8d7:
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     (result_2.m_backend.data._M_elems + 2));
                        }
                        else {
LAB_0029e5f7:
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar8 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar8) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar8 = boost::multiprecision::operator<
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar8) {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                              tVar8 = boost::multiprecision::operator<=
                                                (pnVar4 + lVar20,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar8) goto LAB_0029ef54;
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pFVar17 = (FixBoundsPS *)operator_new(0x30);
                              local_508.m_backend.data._M_elems._32_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                              local_508.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                              local_508.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                              puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                              local_508.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                              local_508.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2)
                              ;
                              local_508.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                              local_508.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                              local_508.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                              local_508.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_6f0,
                                           &psVar13->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar17,lp,iVar24,&local_508,
                                         (shared_ptr<soplex::Tolerances> *)&local_6f0);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar17);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_6f0._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])
                                        (lp,lVar20,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).low.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                              goto LAB_0029e8d7;
                            }
                          }
                        }
                      }
                      else {
                        pnVar4 = (lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).up.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        pdVar16 = (double *)infinity();
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                        tVar8 = boost::multiprecision::operator>=
                                          (pnVar4 + (int)uVar12,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&result_2.m_backend);
                        if (tVar8) {
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar8 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar8) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar8 = boost::multiprecision::operator>
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar8) {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,*pdVar16,(type *)0x0);
                              tVar8 = boost::multiprecision::operator>=
                                                (pnVar4 + lVar20,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar8) goto LAB_0029ef54;
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pFVar17 = (FixBoundsPS *)operator_new(0x30);
                              local_548.m_backend.data._M_elems._32_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                              local_548.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                              local_548.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                              puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                              local_548.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                              local_548.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2)
                              ;
                              local_548.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                              local_548.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                              local_548.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                              local_548.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_700,
                                           &psVar13->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar17,lp,iVar24,&local_548,
                                         (shared_ptr<soplex::Tolerances> *)&local_700);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar17);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_700._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])
                                        (lp,lVar20,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                              goto LAB_0029e8d7;
                            }
                          }
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar8 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                          if (tVar8) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar8 = boost::multiprecision::operator<
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar8) {
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pdVar16 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar16,(type *)0x0);
                              tVar8 = boost::multiprecision::operator<=
                                                (pnVar4 + lVar20,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar8) goto LAB_0029ef54;
                              pnVar4 = (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pFVar17 = (FixBoundsPS *)operator_new(0x30);
                              local_588.m_backend.data._M_elems._32_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                              local_588.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                              local_588.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                              puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                              local_588.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                              local_588.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2)
                              ;
                              local_588.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                              local_588.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                              local_588.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                              local_588.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_710,
                                           &psVar13->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar17,lp,iVar24,&local_588,
                                         (shared_ptr<soplex::Tolerances> *)&local_710);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar17);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_710._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])
                                        (lp,lVar20,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).low.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                              goto LAB_0029e8d7;
                            }
                          }
                        }
                      }
                      pnVar4 = (lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_5c8.m_backend.data._M_elems._32_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                      local_5c8.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                      local_5c8.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                      puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                      local_5c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                      local_5c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                      local_5c8.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                      local_5c8.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                      local_5c8.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                      local_5c8.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                      pnVar4 = (lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).up.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_608.m_backend.data._M_elems._32_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 8);
                      local_608.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)&pnVar4[lVar20].m_backend.data;
                      local_608.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)(pnVar4[lVar20].m_backend.data._M_elems + 2);
                      puVar1 = pnVar4[lVar20].m_backend.data._M_elems + 4;
                      local_608.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                      local_608.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                      local_608.m_backend.exp = pnVar4[lVar20].m_backend.exp;
                      local_608.m_backend.neg = pnVar4[lVar20].m_backend.neg;
                      local_608.m_backend.fpclass = pnVar4[lVar20].m_backend.fpclass;
                      local_608.m_backend.prec_elem = pnVar4[lVar20].m_backend.prec_elem;
                      feastol(&local_228,this);
                      bVar10 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         (&local_5c8,&local_608,&local_228);
                      if (bVar10) {
                        remCol.data[lVar20] = true;
                        fixAndRemCol.data[lVar20] = true;
                        piVar6 = (this->m_stat).data + 0xd;
                        *piVar6 = *piVar6 + 1;
                      }
                    }
LAB_0029ea18:
                    pDVar18 = (this->m_dupCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                }
              }
              lVar25 = lVar25 + 0x3c;
            }
            lVar21 = lVar21 + 0x3c;
            lVar20 = local_8d0 + 1;
          }
        }
      }
LAB_0029ef73:
      lVar22 = 0;
      while( true ) {
        uVar12 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        if ((int)uVar12 <= lVar22) break;
        if (fixAndRemCol.data[lVar22] == true) {
          fixColumn(this,lp,(int)lVar22,false);
        }
        lVar22 = lVar22 + 1;
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,uVar12);
      pIVar26 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar5 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar14 = 0;
      uVar29 = 0;
      if (0 < (int)uVar12) {
        uVar29 = (ulong)uVar12;
      }
      iVar24 = 0;
      for (; uVar29 != uVar14; uVar14 = uVar14 + 1) {
        if (remCol.data[uVar14] == true) {
          perm[uVar14] = -1;
          remCols = remCols + 1;
          iVar24 = iVar24 + pIVar26[pDVar5[uVar14].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
        }
        else {
          perm[uVar14] = 0;
        }
      }
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x17])(lp,perm);
      piVar6 = (this->m_cIdx).data;
      for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
        if (-1 < (long)perm[uVar14]) {
          piVar6[perm[uVar14]] = piVar6[uVar14];
        }
      }
      DataArray<int>::DataArray(&da_perm,uVar12,0,1.2);
      for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
        da_perm.data[uVar14] = perm[uVar14];
      }
      if (bVar9) {
        pDVar15 = (DuplicateColsPS *)operator_new(0x168);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_260,1.0,(type *)0x0);
        DataArray<int>::DataArray(&local_620,&da_perm);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_640,
                   &psVar13->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        DuplicateColsPS::DuplicateColsPS
                  (pDVar15,lp,0,0,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_260,&local_620,(shared_ptr<soplex::Tolerances> *)&local_640,false,true)
        ;
        std::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                    *)&compare,pDVar15);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_640._M_refcount);
        DataArray<int>::~DataArray(&local_620);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&this_00->data,(value_type *)&compare);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (compare.epsiloncompare.m_backend.data._M_elems + 2));
      }
      free(perm);
      iVar27 = remCols;
      perm = (int *)0x0;
      if (0 < remCols) {
        piVar6 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remCols;
        *piVar6 = *piVar6 + remCols;
        piVar6 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar6 = *piVar6 + iVar24;
        pSVar19 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar19 != (SPxOut *)0x0) && (3 < (int)pSVar19->m_verbosity)) {
          compare.epsiloncompare.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
          factor.m_backend.data._M_elems[0] = 4;
          (*pSVar19->_vptr_SPxOut[2])();
          pSVar19 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate columns) removed ");
          pSVar19 = soplex::operator<<(pSVar19,iVar27);
          pSVar19 = soplex::operator<<(pSVar19," cols, ");
          pSVar19 = soplex::operator<<(pSVar19,iVar24);
          pSVar19 = soplex::operator<<(pSVar19," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar19->m_streams[pSVar19->m_verbosity]);
          pSVar19 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar19->_vptr_SPxOut[2])(pSVar19,&compare);
        }
        compare.epsiloncompare.m_backend.fpclass = cpp_dec_float_finite;
        compare.epsiloncompare.m_backend.prec_elem = 10;
        compare.epsiloncompare.m_backend.data._M_elems[0] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[1] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[2] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[3] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[4] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[5] = 0;
        compare.epsiloncompare.m_backend.data._M_elems._24_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems._32_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ = 0;
        compare.epsiloncompare.m_backend.exp = 0;
        compare.epsiloncompare.m_backend.neg = false;
        factor.m_backend.data._M_elems._0_8_ = (long)(int)uVar12;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)&compare,
                   &(this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend,(longlong *)&factor);
        tVar8 = boost::multiprecision::operator>(&remCols,&compare.epsiloncompare);
        if (tVar8) {
          *again = true;
        }
      }
      DataArray<int>::~DataArray(&da_perm);
      RVar11 = OKAY;
LAB_0029f2d2:
      DataArray<int>::~DataArray(&m_perm_empty);
      DataArray<bool>::~DataArray(&fixAndRemCol);
      DataArray<bool>::~DataArray(&remCol);
      IdxSet::~IdxSet(&idxSet);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return RVar11;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}